

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
DualStringMappedVector
          (DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
           *this)

{
  (this->dataStorage).csize = 0;
  (this->dataStorage).dataptr = (FedInfo **)0x0;
  (this->dataStorage).dataSlotsAvailable = 0;
  (this->dataStorage).dataSlotIndex = 0;
  (this->dataStorage).bsize = 0x20;
  (this->dataStorage).freeSlotsAvailable = 0;
  (this->dataStorage).freeIndex = 0;
  (this->dataStorage).freeblocks = (FedInfo **)0x0;
  (this->lookup1)._M_h._M_buckets = &(this->lookup1)._M_h._M_single_bucket;
  (this->lookup1)._M_h._M_bucket_count = 1;
  (this->lookup1)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->lookup1)._M_h._M_element_count = 0;
  (this->lookup1)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->lookup1)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->lookup1)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->names).csize = 0;
  (this->names).dataptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->names).dataSlotsAvailable = 0;
  (this->names).dataSlotIndex = 0;
  (this->names).bsize = 0x20;
  (this->names).freeSlotsAvailable = 0;
  (this->names).freeIndex = 0;
  (this->names).freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->lookup2)._M_h._M_buckets = &(this->lookup2)._M_h._M_single_bucket;
  (this->lookup2)._M_h._M_bucket_count = 1;
  (this->lookup2)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->lookup2)._M_h._M_element_count = 0;
  (this->lookup2)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->lookup2)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->lookup2)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

StableBlockVector() noexcept {}